

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::rleUncompress(int inLength,int maxLength,char *in,char *out)

{
  int iVar1;
  int count_1;
  int count;
  char *outStart;
  char *out_local;
  char *in_local;
  int local_10;
  int maxLength_local;
  int inLength_local;
  
  outStart = out;
  out_local = in;
  in_local._4_4_ = maxLength;
  local_10 = inLength;
  do {
    if (local_10 < 1) {
      return (int)outStart - (int)out;
    }
    if (*out_local < '\0') {
      iVar1 = -(int)*out_local;
      local_10 = local_10 - (iVar1 + 1);
      in_local._4_4_ = in_local._4_4_ + *out_local;
      if ((in_local._4_4_ < 0) || (local_10 < 0)) {
        return 0;
      }
      memcpy(outStart,out_local + 1,(long)iVar1);
      out_local = out_local + 1 + iVar1;
    }
    else {
      iVar1 = (int)*out_local;
      local_10 = local_10 + -2;
      in_local._4_4_ = in_local._4_4_ - (iVar1 + 1);
      if ((in_local._4_4_ < 0) || (local_10 < 0)) {
        return 0;
      }
      memset(outStart,(uint)(byte)out_local[1],(long)(iVar1 + 1));
      iVar1 = iVar1 + 1;
      out_local = out_local + 2;
    }
    outStart = outStart + iVar1;
  } while( true );
}

Assistant:

static int rleUncompress(int inLength, int maxLength, const signed char in[],
                         char out[]) {
  char *outStart = out;

  while (inLength > 0) {
    if (*in < 0) {
      int count = -(static_cast<int>(*in++));
      inLength -= count + 1;

      // Fixes #116: Add bounds check to in buffer.
      if ((0 > (maxLength -= count)) || (inLength < 0)) return 0;

      memcpy(out, in, count);
      out += count;
      in += count;
    } else {
      int count = *in++;
      inLength -= 2;

      if ((0 > (maxLength -= count + 1)) || (inLength < 0)) return 0;

      memset(out, *reinterpret_cast<const char *>(in), count + 1);
      out += count + 1;

      in++;
    }
  }

  return static_cast<int>(out - outStart);
}